

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O2

void test_1d_dynamic<30ul>(void)

{
  uint *t;
  pointer piVar1;
  reference t_00;
  uint local_5c;
  int *local_58;
  vector<int,_std::allocator<int>_> data;
  pointer local_38;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_58._0_1_ = (allocator_type)0x1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x3c,"void test_1d_dynamic() [X = 30UL]",(bool *)&data,(bool *)&local_58);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_58 = (int *)((ulong)local_58._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x3e,"void test_1d_dynamic() [X = 30UL]",(bool *)&data,(bool *)&local_58);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = (int *)CONCAT44(local_58._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x40,"void test_1d_dynamic() [X = 30UL]",(unsigned_long *)&data,(int *)&local_58);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  local_58 = (int *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x42,"void test_1d_dynamic() [X = 30UL]",(unsigned_long *)&data,
             (unsigned_long *)&local_58);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1e;
  local_58 = (pointer)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x43,"void test_1d_dynamic() [X = 30UL]",(unsigned_long *)&data,
             (unsigned_long *)&local_58);
  std::vector<int,_std::allocator<int>_>::vector(&data,0x1e,(allocator_type *)&local_58);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (local_5c = 0; local_5c < 0x1e; local_5c = local_5c + 1) {
    local_58 = (int *)(ulong)local_5c;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x4b,"void test_1d_dynamic() [X = 30UL]",(unsigned_long *)&local_58,(int *)&local_5c
              );
    local_58 = piVar1 + (int)local_5c;
    local_38 = local_58;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x4d,"void test_1d_dynamic() [X = 30UL]",&local_58,&local_38);
    t = (uint *)(piVar1 + (int)local_5c);
    *t = local_5c;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x51,"void test_1d_dynamic() [X = 30UL]",(int *)t,(int *)&local_5c);
    t_00 = std::vector<int,_std::allocator<int>_>::at(&data,(long)(int)local_5c);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i)))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x54,"void test_1d_dynamic() [X = 30UL]",t_00,(int *)&local_5c);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_1d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn>, dimensions<1>, dimensions<0>
    > const l(X);

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    vector<int> data(l[0]);
    int* dptr = data.data();

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(l.index(i))), i); 
    }
}